

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsTime helicsInputGetTime(HelicsInput inp,HelicsError *err)

{
  HelicsInput pvVar1;
  HelicsTime HVar2;
  TimeRepresentation<count_time<9,_long>_> val;
  long local_10;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a91cd;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a91cf;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a91cd:
  pvVar1 = (HelicsInput)0x0;
LAB_001a91cf:
  if (pvVar1 == (HelicsInput)0x0) {
    HVar2 = -1.785e+39;
  }
  else {
    helics::Input::getValue_impl<TimeRepresentation<count_time<9,long>>>
              (*(Input **)((long)pvVar1 + 0x18),&local_10);
    HVar2 = (double)(local_10 % 1000000000) * 1e-09 + (double)(local_10 / 1000000000);
  }
  return HVar2;
}

Assistant:

HelicsTime helicsInputGetTime(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getValue<helics::Time>();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}